

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepends
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs)

{
  bool bVar1;
  reference cc;
  undefined1 local_a8 [8];
  cmCustomCommandGenerator ccg;
  __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_28;
  const_iterator i;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  i._M_current = (cmCustomCommand *)ccs;
  local_28._M_current =
       (cmCustomCommand *)std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(ccs)
  ;
  while( true ) {
    ccg.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end
                            ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
                             i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                        *)&ccg.CommandLines.
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    cc = __gnu_cxx::
         __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
         ::operator*(&local_28);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_a8,cc,
               &(this->super_cmLocalCommonGenerator).ConfigName,(cmLocalGenerator *)this);
    AppendCustomDepend(this,depends,(cmCustomCommandGenerator *)local_a8);
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_a8);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomDepends(
  std::vector<std::string>& depends, const std::vector<cmCustomCommand>& ccs)
{
  for (std::vector<cmCustomCommand>::const_iterator i = ccs.begin();
       i != ccs.end(); ++i) {
    cmCustomCommandGenerator ccg(*i, this->ConfigName, this);
    this->AppendCustomDepend(depends, ccg);
  }
}